

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

bool __thiscall ftxui::Component::Focused(Component *this)

{
  Component *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  
  do {
    pCVar1 = this->parent_;
    if (pCVar1 == (Component *)0x0) break;
    iVar2 = (*pCVar1->_vptr_Component[4])(pCVar1);
    bVar3 = (Component *)CONCAT44(extraout_var,iVar2) == this;
    this = pCVar1;
  } while (bVar3);
  return pCVar1 == (Component *)0x0;
}

Assistant:

bool Component::Focused() {
  Component* current = this;
  for (;;) {
    Component* parent = current->parent_;
    if (!parent)
      return true;
    if (parent->ActiveChild() != current)
      return false;
    current = parent;
  }
}